

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O1

void __thiscall
vkt::ssbo::BufferVar::BufferVar(BufferVar *this,char *name,VarType *type,deUint32 flags)

{
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name,&local_19);
  glu::VarType::VarType(&this->m_type,type);
  this->m_flags = flags;
  return;
}

Assistant:

BufferVar::BufferVar (const char* name, const VarType& type, deUint32 flags)
	: m_name	(name)
	, m_type	(type)
	, m_flags	(flags)
{
}